

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

long jas_stream_seek(jas_stream_t *stream,long offset,int origin)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = jas_getdbglevel();
  if (99 < iVar2) {
    jas_eprintf("jas_stream_seek(%p, %ld, %d)\n",stream,offset,(ulong)(uint)origin);
  }
  uVar1 = stream->bufmode_;
  if ((~uVar1 & 0x30) != 0) {
    *(byte *)&stream->flags_ = (byte)stream->flags_ & 0xfe;
    if ((uVar1 & 0x10) == 0) {
      if (((uVar1 & 0x20) != 0) && (iVar2 = jas_stream_flushbuf(stream,-1), iVar2 != 0)) {
        return -1;
      }
    }
    else if (origin == 1) {
      offset = offset - stream->cnt_;
    }
    stream->cnt_ = 0;
    stream->ptr_ = stream->bufstart_;
    *(byte *)&stream->bufmode_ = (byte)stream->bufmode_ & 0xcf;
    lVar3 = (*stream->ops_->seek_)(stream->obj_,offset,origin);
    if (lVar3 < 0) {
      lVar3 = -1;
    }
    return lVar3;
  }
  __assert_fail("!((stream->bufmode_ & JAS_STREAM_RDBUF) && (stream->bufmode_ & JAS_STREAM_WRBUF))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                ,0x33d,"long jas_stream_seek(jas_stream_t *, long, int)");
}

Assistant:

long jas_stream_seek(jas_stream_t *stream, long offset, int origin)
{
	long newpos;

	JAS_DBGLOG(100, ("jas_stream_seek(%p, %ld, %d)\n", stream, offset,
	  origin));

	/* The buffer cannot be in use for both reading and writing. */
	assert(!((stream->bufmode_ & JAS_STREAM_RDBUF) && (stream->bufmode_ &
	  JAS_STREAM_WRBUF)));

	/* Reset the EOF indicator (since we may not be at the EOF anymore). */
	stream->flags_ &= ~JAS_STREAM_EOF;

	if (stream->bufmode_ & JAS_STREAM_RDBUF) {
		if (origin == SEEK_CUR) {
			offset -= stream->cnt_;
		}
	} else if (stream->bufmode_ & JAS_STREAM_WRBUF) {
		if (jas_stream_flush(stream)) {
			return -1;
		}
	}
	stream->cnt_ = 0;
	stream->ptr_ = stream->bufstart_;
	stream->bufmode_ &= ~(JAS_STREAM_RDBUF | JAS_STREAM_WRBUF);

	if ((newpos = (*stream->ops_->seek_)(stream->obj_, offset, origin))
	  < 0) {
		return -1;
	}

	return newpos;
}